

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O0

void keyboardCallback(GLFWwindow *window,int key,int param_3,int action,int param_5)

{
  ImGuiIO *pIVar1;
  ImGuiIO *io;
  int param_4_local;
  int action_local;
  int param_2_local;
  int key_local;
  GLFWwindow *window_local;
  
  pIVar1 = ImGui::GetIO();
  if (((pIVar1->WantCaptureKeyboard & 1U) == 0) && (action == 1)) {
    if (key == 0x52) {
      loadPrograms();
      g_patch.flags.reset = true;
    }
    else if (key == 0x100) {
      g_app.viewer.hud = (bool)((g_app.viewer.hud ^ 0xffU) & 1);
    }
  }
  return;
}

Assistant:

void
keyboardCallback(
    GLFWwindow* window,
    int key, int, int action, int
) {
    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureKeyboard)
        return;

    if (action == GLFW_PRESS) {
        switch (key) {
            case GLFW_KEY_ESCAPE:
                //glfwSetWindowShouldClose(window, GL_TRUE);
                g_app.viewer.hud = !g_app.viewer.hud;
            break;
            case GLFW_KEY_R:
                loadPrograms();
                g_patch.flags.reset = true;
            break;
            default: break;
        }
    }
}